

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semiintersect_iterator.hpp
# Opt level: O1

bool __thiscall
burst::
semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
::equal(semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
        *this,semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::greater<void>_>
              *that)

{
  int *piVar1;
  iterator_range<const_int_*> *piVar2;
  iterator_range<const_int_*> *piVar3;
  int iVar4;
  int *piVar5;
  size_t __n;
  int *__s2;
  int *__s1;
  iterator_range<const_int_*> *piVar6;
  int **ppiVar7;
  bool bVar8;
  
  piVar2 = (this->m_begin)._M_current;
  piVar6 = (that->m_begin)._M_current;
  if (piVar2 != piVar6) {
    __assert_fail("this->m_begin == that.m_begin",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/semiintersect_iterator.hpp"
                  ,0x147,
                  "bool burst::semiintersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, std::greater<void>>::equal(const semiintersect_iterator<RandomAccessIterator, Compare> &) const [RandomAccessIterator = __gnu_cxx::__normal_iterator<boost::iterator_range<const int *> *, std::vector<boost::iterator_range<const int *>>>, Compare = std::greater<void>]"
                 );
  }
  piVar3 = (this->m_end)._M_current;
  if ((long)piVar3 - (long)piVar2 == (long)(that->m_end)._M_current - (long)piVar6) {
    bVar8 = piVar2 == piVar3;
    if (!bVar8) {
      __s1 = (piVar2->
             super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
             m_Begin;
      piVar5 = (piVar2->
               super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
               ).
               super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
               .
               super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
               .m_End;
      __s2 = (piVar6->
             super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>).
             super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>.
             super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>.
             m_Begin;
      __n = (long)piVar5 - (long)__s1;
      if (__n == (long)(piVar6->
                       super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                       ).
                       super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                       .
                       super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                       .m_End - (long)__s2) {
        ppiVar7 = &piVar6[1].
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_End;
        do {
          piVar6 = piVar2 + 1;
          if ((piVar5 != __s1) && (iVar4 = bcmp(__s1,__s2,__n), iVar4 != 0)) {
            return bVar8;
          }
          bVar8 = piVar6 == piVar3;
          if (bVar8) {
            return bVar8;
          }
          __s1 = (piVar6->
                 super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                 ).
                 super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                 .m_Begin;
          piVar5 = piVar2[1].
                   super_iterator_range_base<const_int_*,_boost::iterators::random_access_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>
                   .m_End;
          __s2 = ((iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *
                  )(ppiVar7 + -1))->m_Begin;
          piVar1 = *ppiVar7;
          __n = (long)piVar5 - (long)__s1;
          ppiVar7 = ppiVar7 + 2;
          piVar2 = piVar6;
        } while (__n == (long)piVar1 - (long)__s2);
      }
    }
    return bVar8;
  }
  return false;
}

Assistant:

bool equal (const semiintersect_iterator & that) const
        {
            assert(this->m_begin == that.m_begin);
            return std::equal(this->m_begin, this->m_end, that.m_begin, that.m_end);
        }